

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAnimationTimer::restartAnimationTimer(QAnimationTimer *this)

{
  bool bVar1;
  QAbstractAnimationTimer *in_RDI;
  QAbstractAnimationTimer *unaff_retaddr;
  QAbstractAnimationTimer *in_stack_ffffffffffffffe8;
  QAbstractAnimationTimer *pQVar2;
  int iVar3;
  
  iVar3._0_1_ = in_RDI[3].isRegistered;
  iVar3._1_1_ = in_RDI[3].isPaused;
  iVar3._2_2_ = *(undefined2 *)&in_RDI[3].field_0x12;
  if (iVar3 == 0) {
    pQVar2 = in_RDI;
    bVar1 = QList<QAbstractAnimation_*>::isEmpty((QList<QAbstractAnimation_*> *)0x669f1b);
    iVar3 = (int)((ulong)pQVar2 >> 0x20);
    if (!bVar1) {
      closestPauseAnimationTimeToFinish(this);
      QUnifiedTimer::pauseAnimationTimer(unaff_retaddr,iVar3);
      return;
    }
  }
  if ((in_RDI->isPaused & 1U) == 0) {
    if ((in_RDI->isRegistered & 1U) == 0) {
      QUnifiedTimer::startAnimationTimer(in_RDI);
    }
  }
  else {
    QUnifiedTimer::resumeAnimationTimer(in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void QAnimationTimer::restartAnimationTimer()
{
    if (runningLeafAnimations == 0 && !runningPauseAnimations.isEmpty())
        QUnifiedTimer::pauseAnimationTimer(this, closestPauseAnimationTimeToFinish());
    else if (isPaused)
        QUnifiedTimer::resumeAnimationTimer(this);
    else if (!isRegistered)
        QUnifiedTimer::startAnimationTimer(this);
}